

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_set.hpp
# Opt level: O0

void __thiscall
cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::do_update
          (ut_set<unsigned_long,_(cappuccino::thread_safe)1> *this,keyed_iterator keyed_position,
          time_point expire_time)

{
  pointer ppVar1;
  pointer ptVar2;
  iterator __x;
  _List_iterator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element> _Var3;
  __off64_t *in_R8;
  size_t in_R9;
  list<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
  *this_00;
  _List_const_iterator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
  local_40;
  iterator local_38;
  _List_const_iterator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
  local_30;
  keyed_element *local_28;
  keyed_element *element;
  ut_set<unsigned_long,_(cappuccino::thread_safe)1> *this_local;
  time_point expire_time_local;
  keyed_iterator keyed_position_local;
  
  element = (keyed_element *)this;
  this_local = (ut_set<unsigned_long,_(cappuccino::thread_safe)1> *)expire_time.__d.__r;
  expire_time_local.__d.__r = (duration)(duration)keyed_position._M_node;
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_long,_cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::keyed_element>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::keyed_element>_>
                         *)&expire_time_local);
  local_28 = &ppVar1->second;
  ptVar2 = std::
           _List_iterator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
           ::operator->(&local_28->m_ttl_position);
  (ptVar2->m_expire_time).__d.__r = (rep_conflict)this_local;
  this_00 = &this->m_ttl_list;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
       ::end(&this->m_ttl_list);
  std::
  _List_const_iterator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>::
  _List_const_iterator(&local_30,&local_38);
  std::
  _List_const_iterator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>::
  _List_const_iterator(&local_40,&local_28->m_ttl_position);
  std::__cxx11::
  list<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
  ::splice(this_00,(int)local_30._M_node,(__off64_t *)&this->m_ttl_list,(int)local_40._M_node,in_R8,
           in_R9,(uint)this_00);
  __x = std::__cxx11::
        list<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
        ::end(&this->m_ttl_list);
  _Var3 = std::
          prev<std::_List_iterator<cappuccino::ut_set<unsigned_long,(cappuccino::thread_safe)1>::ttl_element>>
                    (__x._M_node,1);
  (local_28->m_ttl_position)._M_node = _Var3._M_node;
  return;
}

Assistant:

auto do_update(keyed_iterator keyed_position, std::chrono::steady_clock::time_point expire_time) -> void
    {
        auto& element = keyed_position->second;

        // Update the ttl_element's expire time.
        element.m_ttl_position->m_expire_time = expire_time;

        // Push to the end of the Ttl list.
        m_ttl_list.splice(m_ttl_list.end(), m_ttl_list, element.m_ttl_position);

        // Update the elements iterator to ttl_element.
        element.m_ttl_position = std::prev(m_ttl_list.end());
    }